

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pSVar3;
  State *__result;
  State *__dest;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  State *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pSVar3 = begin(this);
  __result = (State *)slang::detail::allocArray(capacity,0x28);
  __dest = __result + ((long)pos - (long)pSVar3) / 0x28;
  memcpy(__dest,args,0x28);
  pSVar3 = end(this);
  if (pos == pSVar3) {
    __first = begin(this);
    pSVar3 = end(this);
    std::
    uninitialized_move<slang::ast::RecursiveStructMemberIterator::State*,slang::ast::RecursiveStructMemberIterator::State*>
              (__first,pSVar3,__result);
  }
  else {
    pSVar3 = begin(this);
    std::
    uninitialized_move<slang::ast::RecursiveStructMemberIterator::State*,slang::ast::RecursiveStructMemberIterator::State*>
              (pSVar3,pos,__result);
    pSVar3 = end(this);
    std::
    uninitialized_move<slang::ast::RecursiveStructMemberIterator::State*,slang::ast::RecursiveStructMemberIterator::State*>
              (pos,pSVar3,__dest + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pSVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return __dest;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}